

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::objectInvariants
          (Interpreter *this,HeapObject *curr,HeapObject *self,uint *counter,
          vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          *thunks)

{
  _Rb_tree_header *p_Var1;
  unsigned_long uVar2;
  uint uVar3;
  AST *pAVar4;
  Identifier *pIVar5;
  long lVar6;
  value_type from;
  ulong uVar7;
  _Rb_tree_node_base *p_Var8;
  long *plVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  value_type local_70;
  uint *local_68;
  HeapObject *local_60;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *local_58;
  Stack *local_50;
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *local_48;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *local_40;
  long *local_38;
  
  local_60 = self;
  local_58 = thunks;
  while( true ) {
    if (curr == (HeapObject *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = __dynamic_cast(curr,&(anonymous_namespace)::HeapObject::typeinfo,
                             &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
    }
    if (lVar6 == 0) break;
    objectInvariants(this,*(HeapObject **)(lVar6 + 0x18),local_60,counter,local_58);
    curr = *(HeapObject **)(lVar6 + 0x10);
  }
  local_68 = counter;
  if (curr == (HeapObject *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar6 = __dynamic_cast(curr,&(anonymous_namespace)::HeapObject::typeinfo,
                           &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
  }
  if (lVar6 != 0) {
    local_38 = (long *)(lVar6 + 0x70);
    plVar9 = *(long **)(lVar6 + 0x70);
    if (plVar9 != local_38) {
      local_48 = &(this->heap).entities;
      local_50 = &this->stack;
      local_40 = (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  *)(lVar6 + 0x10);
      do {
        pAVar4 = (AST *)plVar9[2];
        from = (value_type)operator_new(0x70);
        pIVar5 = this->idInvariant;
        uVar3 = *local_68;
        *(undefined2 *)&(from->super_HeapEntity).type = 0;
        (from->super_HeapEntity)._vptr_HeapEntity = (_func_int **)&PTR__HeapThunk_00299498;
        from->name = pIVar5;
        p_Var1 = &(from->upValues)._M_t._M_impl.super__Rb_tree_header;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        from->self = local_60;
        from->offset = uVar3;
        from->body = pAVar4;
        local_70 = from;
        std::
        vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
        ::push_back(local_48,(value_type *)&local_70);
        (from->super_HeapEntity).mark = (this->heap).lastMark;
        lVar6 = (long)(this->heap).entities.
                      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->heap).entities.
                      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = lVar6 >> 3;
        (this->heap).numEntities = uVar7;
        if (((this->heap).gcTuneMinObjects < uVar7) &&
           (auVar10._8_4_ = (int)(lVar6 >> 0x23), auVar10._0_8_ = uVar7, auVar10._12_4_ = 0x45300000
           , uVar2 = (this->heap).lastNumEntities, auVar11._8_4_ = (int)(uVar2 >> 0x20),
           auVar11._0_8_ = uVar2, auVar11._12_4_ = 0x45300000,
           ((auVar11._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) *
           (this->heap).gcTuneGrowthTrigger <
           (auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0))) {
          Heap::markFrom(&this->heap,(HeapEntity *)from);
          Stack::mark(local_50,&this->heap);
          if (((this->scratch).t & ARRAY) != NULL_TYPE) {
            Heap::markFrom(&this->heap,(this->scratch).v.h);
          }
          for (p_Var8 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var8 != &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header
              ; p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
            if (*(HeapEntity **)(*(long *)(p_Var8 + 3) + 0x40) != (HeapEntity *)0x0) {
              Heap::markFrom(&this->heap,*(HeapEntity **)(*(long *)(p_Var8 + 3) + 0x40));
            }
          }
          for (p_Var8 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var8 != &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header;
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
            Heap::markFrom(&this->heap,*(HeapEntity **)(p_Var8 + 2));
          }
          Heap::sweep(&this->heap);
        }
        local_70 = from;
        std::
        map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
        ::operator=(&from->upValues,local_40);
        std::
        vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
        ::push_back(local_58,&local_70);
        plVar9 = (long *)*plVar9;
      } while (plVar9 != local_38);
    }
  }
  *local_68 = *local_68 + 1;
  return;
}

Assistant:

void objectInvariants(HeapObject *curr, HeapObject *self, unsigned &counter,
                          std::vector<HeapThunk *> &thunks)
    {
        if (auto *ext = dynamic_cast<HeapExtendedObject *>(curr)) {
            objectInvariants(ext->right, self, counter, thunks);
            objectInvariants(ext->left, self, counter, thunks);
        } else {
            if (auto *simp = dynamic_cast<HeapSimpleObject *>(curr)) {
                for (AST *assert : simp->asserts) {
                    auto *el_th = makeHeap<HeapThunk>(idInvariant, self, counter, assert);
                    el_th->upValues = simp->upValues;
                    thunks.push_back(el_th);
                }
            }
            counter++;
        }
    }